

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_common.h
# Opt level: O0

void release_common(void *t)

{
  long lVar1;
  TCGPool *pTVar2;
  TCGOpDef *def;
  TCGContext_conflict9 *s;
  TCGPool *to;
  TCGPool *po;
  void *t_local;
  
  lVar1 = *(long *)((long)t + 0x8168);
  g_free(*(gpointer *)(lVar1 + 0x10));
  g_free(*(gpointer *)(lVar1 + 0x18));
  g_free(*(gpointer *)((long)t + 0x8168));
  to = *(TCGPool **)((long)t + 0x10);
  while (to != (TCGPool *)0x0) {
    pTVar2 = to->next;
    g_free(to);
    to = pTVar2;
  }
  tcg_pool_reset_tricore((TCGContext_conflict9 *)t);
  g_hash_table_destroy(*(GHashTable **)((long)t + 0x80e0));
  g_hash_table_destroy(*(GHashTable **)((long)t + 33000));
  g_free(*(gpointer *)((long)t + 0x8158));
  g_free(*(gpointer *)(*(long *)((long)t + 0x8160) + 0x10));
  g_free(*(gpointer *)((long)t + 0x8160));
  g_tree_destroy(*(GTree **)((long)t + 0x8138));
  memory_free_tricore(*(uc_struct_conflict15 **)((long)t + 0x8170));
  address_space_destroy_tricore((AddressSpace *)(*(long *)((long)t + 0x8170) + 0x10));
  address_space_destroy_tricore((AddressSpace *)(*(long *)((long)t + 0x8170) + 0x48));
  tb_cleanup_tricore(*(uc_struct_conflict15 **)((long)t + 0x8170));
  free_code_gen_buffer_tricore(*(uc_struct_conflict15 **)((long)t + 0x8170));
  qht_destroy((qht *)((long)t + 0x80b8));
  cpu_watchpoint_remove_all_tricore(*(CPUState **)(*(long *)((long)t + 0x8170) + 0x1a0),0x20);
  cpu_breakpoint_remove_all_tricore(*(CPUState **)(*(long *)((long)t + 0x8170) + 0x1a0),0x20);
  return;
}

Assistant:

static void release_common(void *t)
{
    TCGPool *po, *to;
    TCGContext *s = (TCGContext *)t;
#if TCG_TARGET_REG_BITS == 32
    int i;
#endif

    // Clean TCG.
    TCGOpDef* def = s->tcg_op_defs;
    g_free(def->args_ct);
    g_free(def->sorted_args);
    g_free(s->tcg_op_defs);

    for (po = s->pool_first; po; po = to) {
        to = po->next;
        g_free(po);
    }
    tcg_pool_reset(s);
    g_hash_table_destroy(s->helper_table);
    g_hash_table_destroy(s->custom_helper_infos);
    g_free(s->indirect_reg_alloc_order);
    /* qemu/tcg/tcg/c:4018: img = g_malloc(img_size); */
    g_free((void *)(s->one_entry->symfile_addr));
    g_free(s->one_entry);
    /* qemu/tcg/tcg/c:574: tcg_ctx->tree = g_tree_new(tb_tc_cmp); */
    g_tree_destroy(s->tree);

    // these function is not available outside qemu
    // so we keep them here instead of outside uc_close.
    memory_free(s->uc);
    address_space_destroy(&s->uc->address_space_memory);
    address_space_destroy(&s->uc->address_space_io);
    /* clean up uc->l1_map. */
    tb_cleanup(s->uc);
    /* clean up tcg_ctx->code_gen_buffer. */
    free_code_gen_buffer(s->uc);
    /* qemu/util/qht.c:264: map = qht_map_create(n_buckets); */
    qht_destroy(&s->tb_ctx.htable);

    cpu_watchpoint_remove_all(CPU(s->uc->cpu), BP_CPU);
    cpu_breakpoint_remove_all(CPU(s->uc->cpu), BP_CPU);

#if TCG_TARGET_REG_BITS == 32
    for(i = 0; i < s->nb_globals; i++) {
        TCGTemp *ts = &s->temps[i];
        if (ts->base_type == TCG_TYPE_I64) {
            if (ts->name && ((strcmp(ts->name+(strlen(ts->name)-2), "_0") == 0) ||
                        (strcmp(ts->name+(strlen(ts->name)-2), "_1") == 0))) {
                free((void *)ts->name);
            }
        }
    }
#endif
}